

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O2

Cut_Cut_t * Cut_CutMergeLists(Cut_Cut_t *pList1,Cut_Cut_t *pList2)

{
  int iVar1;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t *pCVar3;
  Cut_Cut_t **ppCVar4;
  Cut_Cut_t *pList;
  Cut_Cut_t *local_20;
  
  ppCVar4 = &local_20;
  local_20 = (Cut_Cut_t *)0x0;
  while ((pList1 != (Cut_Cut_t *)0x0 && (pList2 != (Cut_Cut_t *)0x0))) {
    iVar1 = Cut_CutCompare(pList1,pList2);
    if (iVar1 < 0) {
      pCVar2 = pList1->pNext;
      pCVar3 = pList2;
    }
    else {
      pCVar2 = pList1;
      pCVar3 = pList2->pNext;
      pList1 = pList2;
    }
    *ppCVar4 = pList1;
    ppCVar4 = &pList1->pNext;
    pList2 = pCVar3;
    pList1 = pCVar2;
  }
  if (pList1 != (Cut_Cut_t *)0x0) {
    pList2 = pList1;
  }
  *ppCVar4 = pList2;
  return local_20;
}

Assistant:

Cut_Cut_t * Cut_CutMergeLists( Cut_Cut_t * pList1, Cut_Cut_t * pList2 )
{
    Cut_Cut_t * pList = NULL, ** ppTail = &pList;
    Cut_Cut_t * pCut;
    while ( pList1 && pList2 )
    {
        if ( Cut_CutCompare(pList1, pList2) < 0 )
        {
            pCut = pList1;
            pList1 = pList1->pNext;
        }
        else
        {
            pCut = pList2;
            pList2 = pList2->pNext;
        }
        *ppTail = pCut;
        ppTail = &pCut->pNext;
    }
    *ppTail = pList1? pList1: pList2;
    return pList;
}